

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

bool __thiscall HighsSymmetryDetection::partitionRefinement(HighsSymmetryDetection *this)

{
  HighsHashTable<int,_unsigned_int> *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  ValueType VVar1;
  int *piVar2;
  pointer piVar3;
  bool bVar4;
  pointer piVar5;
  ValueType *pVVar6;
  int *piVar7;
  int iVar8;
  int bad_allowed;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  pointer piVar14;
  long lVar15;
  HighsInt splitPoint;
  ValueType VVar16;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_65;
  int local_64;
  ulong local_60;
  int local_58;
  int local_54;
  long local_50;
  u64 local_48;
  u64 local_40;
  u64 local_38;
  
  piVar14 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar5 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar14 != piVar5) {
    this_00 = &this->vertexHash;
    do {
      if (4 < (long)piVar5 - (long)piVar14) {
        iVar12 = piVar5[-1];
        piVar5[-1] = *piVar14;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                  (piVar14,0,(long)piVar5 + (-4 - (long)piVar14) >> 2,iVar12);
        piVar5 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      local_58 = piVar5[-1];
      local_50 = (long)local_58;
      (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar5 + -1;
      (this->cellInRefinementQueue).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[local_50] = '\0';
      local_64 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start[local_50];
      uVar9 = local_60;
      if (local_64 - local_58 != 1) {
        local_60 = (ulong)local_64;
        piVar5 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar14 = piVar5 + local_50;
        if (local_64 != local_58) {
          piVar7 = piVar5 + local_60;
          piVar2 = piVar14;
          do {
            while( true ) {
              piVar5 = piVar2;
              local_54 = *piVar5;
              bVar4 = HighsHashTable<int,_unsigned_int>::findPosition
                                (this_00,&local_54,&local_65,&local_38,&local_40,&local_48);
              if (bVar4) break;
              piVar14 = piVar7;
              piVar2 = piVar5 + 1;
              if (piVar5 + 1 == piVar7) goto LAB_002f9ddf;
            }
            do {
              piVar7 = piVar7 + -1;
              piVar14 = piVar5;
              if (piVar7 == piVar5) goto LAB_002f9ddf;
              local_54 = *piVar7;
              bVar4 = HighsHashTable<int,_unsigned_int>::findPosition
                                (this_00,&local_54,&local_65,&local_38,&local_40,&local_48);
            } while (bVar4);
            iVar12 = *piVar5;
            *piVar5 = *piVar7;
            *piVar7 = iVar12;
            piVar2 = piVar5 + 1;
          } while (piVar7 != piVar5 + 1);
          piVar14 = piVar5 + 1;
        }
LAB_002f9ddf:
        lVar13 = local_50;
        iVar12 = local_58;
        piVar5 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = (ulong)((long)piVar14 - (long)piVar5) >> 2;
        iVar8 = (int)uVar9;
        if (local_64 != iVar8) {
          lVar15 = ((long)piVar14 - (long)piVar5) * 0x40000000 >> 0x1e;
          lVar10 = local_60 * 4 - lVar15;
          if (lVar10 != 0) {
            uVar11 = lVar10 >> 2;
            bad_allowed = 0;
            if (1 < uVar11) {
              bad_allowed = 0;
              do {
                uVar11 = (long)uVar11 >> 1;
                bad_allowed = bad_allowed + 1;
              } while (1 < uVar11);
            }
            end._M_current = piVar5 + local_60;
            local_60 = uVar9;
            pdqsort_detail::
            pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::partitionRefinement()::__1,false>
                      ((int *)(lVar15 + (long)piVar5),end,(anon_class_8_1_8991fb9c)this,bad_allowed,
                       true);
            uVar9 = local_60;
          }
          local_60 = uVar9;
          if (iVar12 != iVar8) {
            bVar4 = splitCell(this,iVar12,iVar8);
            if (!bVar4) {
              piVar7 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start;
              piVar2 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              if (piVar7 != piVar2) {
                do {
                  (this->cellInRefinementQueue).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[*piVar7] = '\0';
                  piVar7 = piVar7 + 1;
                } while (piVar7 != piVar2);
                piVar14 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if ((this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish != piVar14) {
                  (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = piVar14;
                }
              }
              bVar4 = false;
              goto LAB_002f9f2c;
            }
            updateCellMembership(this,iVar8,iVar8,true);
            lVar13 = (long)iVar8;
            iVar12 = iVar8;
          }
          pVVar6 = HighsHashTable<int,_unsigned_int>::operator[]
                             (this_00,(this->currentPartition).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar13);
          uVar9 = local_60;
          if (iVar12 + 1 < local_64) {
            VVar16 = *pVVar6;
            lVar13 = (long)(iVar12 + 1);
            do {
              local_48._0_4_ =
                   (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13];
              pVVar6 = HighsHashTable<int,_unsigned_int>::operator[]
                                 (this_00,(KeyType_conflict *)&local_48);
              VVar1 = *pVVar6;
              splitPoint = (HighsInt)lVar13;
              if ((VVar16 != VVar1) &&
                 (bVar4 = splitCell(this,iVar12,splitPoint), lVar10 = local_50, iVar8 = local_58,
                 uVar9 = local_60, iVar12 = splitPoint, VVar16 = VVar1, !bVar4)) {
                piVar7 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                piVar2 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                if (piVar7 != piVar2) {
                  do {
                    (this->cellInRefinementQueue).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[*piVar7] = '\0';
                    piVar7 = piVar7 + 1;
                  } while (piVar7 != piVar2);
                  piVar14 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  if ((this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish != piVar14) {
                    (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = piVar14;
                  }
                }
                HighsHashTable<int,_unsigned_int>::clear(this_00);
                piVar14 = (this->currentPartitionLinks).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar14[lVar10] = local_64;
                if ((int)uVar9 <= splitPoint + -1) {
                  piVar5 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  piVar3 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar13 = (long)(splitPoint + -1) + 1;
                  do {
                    iVar12 = piVar5[lVar13 + -1];
                    if ((piVar3[iVar12] != iVar8) && (piVar3[iVar12] = iVar8, lVar13 - lVar10 != 1))
                    {
                      piVar14[lVar13 + -1] = iVar8;
                    }
                    lVar13 = lVar13 + -1;
                  } while ((int)uVar9 < lVar13);
                }
                return false;
              }
              updateCellMembership(this,splitPoint,iVar12,true);
              lVar13 = lVar13 + 1;
              uVar9 = local_60;
            } while (local_64 != (int)lVar13);
          }
        }
      }
      local_60 = uVar9;
      piVar14 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (piVar14 != piVar5);
  }
  bVar4 = true;
LAB_002f9f2c:
  HighsHashTable<int,_unsigned_int>::clear(&this->vertexHash);
  return bVar4;
}

Assistant:

bool HighsSymmetryDetection::partitionRefinement() {
  while (!refinementQueue.empty()) {
    std::pop_heap(refinementQueue.begin(), refinementQueue.end(),
                  std::greater<HighsInt>());

    HighsInt cellStart = refinementQueue.back();
    HighsInt firstCellStart = cellStart;
    refinementQueue.pop_back();
    cellInRefinementQueue[cellStart] = false;

    if (cellSize(cellStart) == 1) continue;
    HighsInt cellEnd = currentPartitionLinks[cellStart];
    assert(cellEnd >= cellStart);

    // first check which vertices do have updated hash values and put them to
    // the end of the partition
    HighsInt refineStart =
        std::partition(
            currentPartition.begin() + cellStart,
            currentPartition.begin() + cellEnd,
            [&](HighsInt v) { return vertexHash.find(v) == nullptr; }) -
        currentPartition.begin();

    // if there are none there is nothing to refine
    if (refineStart == cellEnd) continue;

    // sort the vertices that have updated hash values by their hash values
    pdqsort(currentPartition.begin() + refineStart,
            currentPartition.begin() + cellEnd, [&](HighsInt v1, HighsInt v2) {
              return vertexHash[v1] < vertexHash[v2];
            });

    // if not all vertices have updated hash values directly create the first
    // new cell at the start of the range that we want to refine
    if (refineStart != cellStart) {
      assert(refineStart != cellStart);
      assert(refineStart != cellEnd);
      if (!splitCell(cellStart, refineStart)) {
        // node can be pruned, make sure hash values are cleared and queue is
        // empty
        for (HighsInt c : refinementQueue) cellInRefinementQueue[c] = false;
        refinementQueue.clear();
        vertexHash.clear();
        return false;
      }
      cellStart = refineStart;
      updateCellMembership(cellStart, cellStart);
    }

    // now update the remaining vertices
    bool prune = false;
    HighsInt i;
    assert(vertexHash.find(currentPartition[cellStart]) != nullptr);
    // store value of first hash
    u64 lastHash = vertexHash[currentPartition[cellStart]];
    for (i = cellStart + 1; i < cellEnd; ++i) {
      HighsInt vertex = currentPartition[i];
      // get this vertex hash value
      u64 hash = vertexHash[vertex];

      if (hash != lastHash) {
        // hash values do not match -> start of new cell
        if (!splitCell(cellStart, i)) {
          // refinement process yielded bad prefix of certificate
          // -> node can be pruned
          prune = true;
          break;
        }
        cellStart = i;
        // remember hash value of this new cell under lastHash
        lastHash = hash;
      }

      // update membership of vertex to new cell
      updateCellMembership(i, cellStart);
    }

    if (prune) {
      // node can be pruned, make sure hash values are cleared and queue is
      // empty
      for (HighsInt c : refinementQueue) cellInRefinementQueue[c] = false;
      refinementQueue.clear();
      vertexHash.clear();
      currentPartitionLinks[firstCellStart] = cellEnd;

      // undo possibly incomplete changes done to the cells
      for (--i; i >= refineStart; --i)
        updateCellMembership(i, firstCellStart, false);

      return false;
    }

    assert(currentPartitionLinks[cellStart] == cellEnd);
  }

  vertexHash.clear();

  return true;
}